

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O0

Aig_Man_t * Saig_ManCreateMiter(Aig_Man_t *p0,Aig_Man_t *p1,int Oper)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *p;
  char *pcVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  Aig_Obj_t *pAVar8;
  int local_34;
  Aig_Obj_t *pAStack_30;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int Oper_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  iVar2 = Saig_ManRegNum(p0);
  if ((iVar2 < 1) && (iVar2 = Saig_ManRegNum(p1), iVar2 < 1)) {
    __assert_fail("Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x69,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar2 = Saig_ManPiNum(p0);
  iVar3 = Saig_ManPiNum(p1);
  if (iVar2 != iVar3) {
    __assert_fail("Saig_ManPiNum(p0) == Saig_ManPiNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x6a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar2 = Saig_ManPoNum(p0);
  iVar3 = Saig_ManPoNum(p1);
  if (iVar2 != iVar3) {
    __assert_fail("Saig_ManPoNum(p0) == Saig_ManPoNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                  ,0x6b,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
  }
  iVar2 = Aig_ManObjNumMax(p0);
  iVar3 = Aig_ManObjNumMax(p1);
  p = Aig_ManStart(iVar2 + iVar3);
  pcVar4 = Abc_UtilStrsav("miter");
  p->pName = pcVar4;
  Aig_ManCleanData(p0);
  Aig_ManCleanData(p1);
  pAVar5 = Aig_ManConst1(p);
  pAVar6 = Aig_ManConst1(p0);
  (pAVar6->field_5).pData = pAVar5;
  pAVar5 = Aig_ManConst1(p);
  pAVar6 = Aig_ManConst1(p1);
  (pAVar6->field_5).pData = pAVar5;
  for (local_34 = 0; iVar2 = Saig_ManPiNum(p0), local_34 < iVar2; local_34 = local_34 + 1) {
    pvVar7 = Vec_PtrEntry(p0->vCis,local_34);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_34 = 0; iVar2 = Saig_ManPiNum(p1), local_34 < iVar2; local_34 = local_34 + 1) {
    pvVar7 = Vec_PtrEntry(p1->vCis,local_34);
    pAVar5 = Aig_ManCi(p,local_34);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_34 = 0; iVar2 = Saig_ManRegNum(p0), local_34 < iVar2; local_34 = local_34 + 1) {
    pVVar1 = p0->vCis;
    iVar2 = Saig_ManPiNum(p0);
    pvVar7 = Vec_PtrEntry(pVVar1,local_34 + iVar2);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_34 = 0; iVar2 = Saig_ManRegNum(p1), local_34 < iVar2; local_34 = local_34 + 1) {
    pVVar1 = p1->vCis;
    iVar2 = Saig_ManPiNum(p1);
    pvVar7 = Vec_PtrEntry(pVVar1,local_34 + iVar2);
    pAVar5 = Aig_ObjCreateCi(p);
    *(Aig_Obj_t **)((long)pvVar7 + 0x28) = pAVar5;
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p0->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_34);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      pAVar8 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p,pAVar6,pAVar8);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  for (local_34 = 0; iVar2 = Vec_PtrSize(p1->vObjs), local_34 < iVar2; local_34 = local_34 + 1) {
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,local_34);
    if ((pAVar5 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar5), iVar2 != 0)) {
      pAVar6 = Aig_ObjChild0Copy(pAVar5);
      pAVar8 = Aig_ObjChild1Copy(pAVar5);
      pAVar6 = Aig_And(p,pAVar6,pAVar8);
      (pAVar5->field_5).pData = pAVar6;
    }
  }
  local_34 = 0;
  do {
    iVar2 = Saig_ManPoNum(p0);
    if (iVar2 <= local_34) {
      for (local_34 = 0; iVar2 = Saig_ManRegNum(p0), local_34 < iVar2; local_34 = local_34 + 1) {
        pVVar1 = p0->vCos;
        iVar2 = Saig_ManPoNum(p0);
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_34 + iVar2);
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        pAVar6 = Aig_ObjCreateCo(p,pAVar6);
        (pAVar5->field_5).pData = pAVar6;
      }
      for (local_34 = 0; iVar2 = Saig_ManRegNum(p1), local_34 < iVar2; local_34 = local_34 + 1) {
        pVVar1 = p1->vCos;
        iVar2 = Saig_ManPoNum(p1);
        pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_34 + iVar2);
        pAVar6 = Aig_ObjChild0Copy(pAVar5);
        pAVar6 = Aig_ObjCreateCo(p,pAVar6);
        (pAVar5->field_5).pData = pAVar6;
      }
      iVar2 = Saig_ManRegNum(p0);
      iVar3 = Saig_ManRegNum(p1);
      Aig_ManSetRegNum(p,iVar2 + iVar3);
      return p;
    }
    pAVar5 = (Aig_Obj_t *)Vec_PtrEntry(p0->vCos,local_34);
    if (Oper == 0) {
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      pAVar6 = Aig_ManCo(p1,local_34);
      pAVar6 = Aig_ObjChild0Copy(pAVar6);
      pAStack_30 = Aig_Exor(p,pAVar5,pAVar6);
    }
    else {
      if (Oper != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigMiter.c"
                      ,0x8a,"Aig_Man_t *Saig_ManCreateMiter(Aig_Man_t *, Aig_Man_t *, int)");
      }
      pAVar5 = Aig_ObjChild0Copy(pAVar5);
      pAVar6 = Aig_ManCo(p1,local_34);
      pAVar6 = Aig_ObjChild0Copy(pAVar6);
      pAVar6 = Aig_Not(pAVar6);
      pAStack_30 = Aig_And(p,pAVar5,pAVar6);
    }
    Aig_ObjCreateCo(p,pAStack_30);
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCreateMiter( Aig_Man_t * p0, Aig_Man_t * p1, int Oper )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj;
    int i;
    assert( Saig_ManRegNum(p0) > 0 || Saig_ManRegNum(p1) > 0 );
    assert( Saig_ManPiNum(p0) == Saig_ManPiNum(p1) );
    assert( Saig_ManPoNum(p0) == Saig_ManPoNum(p1) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p0) + Aig_ManObjNumMax(p1) );
    pNew->pName = Abc_UtilStrsav( "miter" );
    Aig_ManCleanData( p0 );
    Aig_ManCleanData( p1 );
    // map constant nodes
    Aig_ManConst1(p0)->pData = Aig_ManConst1(pNew);
    Aig_ManConst1(p1)->pData = Aig_ManConst1(pNew);
    // map primary inputs
    Saig_ManForEachPi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachPi( p1, pObj, i )
        pObj->pData = Aig_ManCi( pNew, i );
    // map register outputs
    Saig_ManForEachLo( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Saig_ManForEachLo( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // map internal nodes
    Aig_ManForEachNode( p0, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    Aig_ManForEachNode( p1, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create primary outputs
    Saig_ManForEachPo( p0, pObj, i )
    {
        if ( Oper == 0 ) // XOR
            pObj = Aig_Exor( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild0Copy(Aig_ManCo(p1,i)) );
        else if ( Oper == 1 ) // implication is PO(p0) -> PO(p1)  ...  complement is PO(p0) & !PO(p1) 
            pObj = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_Not(Aig_ObjChild0Copy(Aig_ManCo(p1,i))) );
        else
            assert( 0 );
        Aig_ObjCreateCo( pNew, pObj );
    }
    // create register inputs
    Saig_ManForEachLi( p0, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    Saig_ManForEachLi( p1, pObj, i )
        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // cleanup
    Aig_ManSetRegNum( pNew, Saig_ManRegNum(p0) + Saig_ManRegNum(p1) );
//    Aig_ManCleanup( pNew );
    return pNew;
}